

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

bool __thiscall V4L2Device::init_buffers(V4L2Device *this)

{
  int iVar1;
  void *pvVar2;
  Writer *pWVar3;
  int *piVar4;
  bool bVar5;
  size_t *psVar6;
  ulong uVar7;
  char *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ulong uStack_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  Writer local_b8;
  undefined8 local_44;
  undefined4 local_3c;
  undefined8 local_38;
  
  local_38 = 0;
  local_3c = 1;
  local_44 = 0x100000020;
  iVar1 = ioctl(this->fd,0xc0145608);
  if (iVar1 < 0) {
    local_b8._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
    local_b8.m_level = Error;
    local_b8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_b8.m_line = 0x165;
    local_b8.m_func = "bool V4L2Device::init_buffers()";
    local_b8.m_verboseLevel = 0;
    local_b8.m_logger = (Logger *)0x0;
    local_b8.m_proceed = false;
    local_b8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_b8.m_messageBuilder.m_containerLogSeperator = "";
    local_b8.m_dispatchAction = NormalLog;
    local_b8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_b8,1,"default");
    pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [24])"VIDIOC_REQBUFS failed: ");
    piVar4 = __errno_location();
    local_110 = strerror(*piVar4);
    el::base::Writer::operator<<(pWVar3,(char **)&local_110);
    el::base::Writer::~Writer(&local_b8);
    bVar5 = false;
  }
  else {
    psVar6 = &(this->buffers)._M_elems[0].size;
    for (uVar7 = 0; uVar7 != 0x20; uVar7 = uVar7 + 1) {
      local_c8 = 0;
      uStack_c0 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_d8 = 0x100000000;
      local_110 = (char *)CONCAT44(1,(int)uVar7);
      iVar1 = ioctl(this->fd,0xc0585609,&local_110);
      if (iVar1 < 0) {
        local_b8._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
        local_b8.m_level = Error;
        local_b8.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
        ;
        local_b8.m_line = 0x173;
        local_b8.m_func = "bool V4L2Device::init_buffers()";
        local_b8.m_verboseLevel = 0;
        local_b8.m_logger = (Logger *)0x0;
        local_b8.m_proceed = false;
        local_b8.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b8.m_messageBuilder.m_containerLogSeperator = "";
        local_b8.m_dispatchAction = NormalLog;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar3 = el::base::Writer::construct(&local_b8,1,"default");
        pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [25])"VIDIOC_QUERYBUF failed: ");
        piVar4 = __errno_location();
        local_118 = strerror(*piVar4);
        el::base::Writer::operator<<(pWVar3,&local_118);
LAB_0015207b:
        el::base::Writer::~Writer(&local_b8);
        return 0x1f < uVar7;
      }
      pvVar2 = mmap((void *)0x0,local_c8 & 0xffffffff,3,1,this->fd,uStack_d0 & 0xffffffff);
      ((IOBuffer *)(psVar6 + -1))->start = pvVar2;
      if (pvVar2 == (void *)0xffffffffffffffff) {
        local_b8._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
        local_b8.m_level = Error;
        local_b8.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
        ;
        local_b8.m_line = 0x179;
        local_b8.m_func = "bool V4L2Device::init_buffers()";
        local_b8.m_verboseLevel = 0;
        local_b8.m_logger = (Logger *)0x0;
        local_b8.m_proceed = false;
        local_b8.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b8.m_messageBuilder.m_containerLogSeperator = "";
        local_b8.m_dispatchAction = NormalLog;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar3 = el::base::Writer::construct(&local_b8,1,"default");
        pWVar3 = el::base::Writer::operator<<(pWVar3,(char (*) [24])"mmaping buffer failed: ");
        piVar4 = __errno_location();
        local_118 = strerror(*piVar4);
        el::base::Writer::operator<<(pWVar3,&local_118);
        goto LAB_0015207b;
      }
      *psVar6 = local_c8 & 0xffffffff;
      psVar6 = psVar6 + 2;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool
    init_buffers()
    {
        struct v4l2_requestbuffers bufrequest;
        std::memset(&bufrequest, 0, sizeof(bufrequest));

        bufrequest.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
        bufrequest.memory = V4L2_MEMORY_MMAP;
        bufrequest.count = kBuffersCount;

        if (ioctl(fd, VIDIOC_REQBUFS, &bufrequest) < 0) {
            LOG(ERROR) << "VIDIOC_REQBUFS failed: " << strerror(errno);
            return false;
        }

        struct v4l2_buffer bufferinfo;

        for (int i = 0; i < kBuffersCount; i++) {
            std::memset(&bufferinfo, 0, sizeof(bufferinfo));

            bufferinfo.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
            bufferinfo.memory = V4L2_MEMORY_MMAP;
            bufferinfo.index = i;

            if (ioctl(fd, VIDIOC_QUERYBUF, &bufferinfo) < 0) {
                LOG(ERROR) << "VIDIOC_QUERYBUF failed: " << strerror(errno);
                return false;
            }

            buffers[i].start = mmap(NULL, bufferinfo.length, PROT_READ | PROT_WRITE, MAP_SHARED, fd, bufferinfo.m.offset);
            if (buffers[i].start == MAP_FAILED) {
                LOG(ERROR) << "mmaping buffer failed: " << strerror(errno);
                return false;
            }

            buffers[i].size = bufferinfo.length;
        }

        return true;
    }